

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall kj::Promise<siginfo_t>::wait(Promise<siginfo_t> *this,void *__stat_loc)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *node;
  ExceptionOr<siginfo_t> *result_00;
  undefined8 in_RDX;
  undefined1 in_stack_00000008 [24];
  undefined1 local_238 [8];
  ExceptionOr<siginfo_t> result;
  WaitScope *waitScope_local;
  Promise<siginfo_t> *this_local;
  
  result.value.ptr.field_1._120_8_ = in_RDX;
  kj::_::ExceptionOr<siginfo_t>::ExceptionOr((ExceptionOr<siginfo_t> *)local_238);
  node = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)__stat_loc);
  kj::_::waitImpl(node,(ExceptionOrValue *)local_238,(WaitScope *)result.value.ptr.field_1._120_8_,
                  (SourceLocation)in_stack_00000008);
  result_00 = mv<kj::_::ExceptionOr<siginfo_t>>((ExceptionOr<siginfo_t> *)local_238);
  kj::_::convertToReturn<siginfo_t>((anon_struct_128_5_975a5653_for_value *)this,result_00);
  kj::_::ExceptionOr<siginfo_t>::~ExceptionOr((ExceptionOr<siginfo_t> *)local_238);
  return (__pid_t)this;
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}